

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_Print(FParser *this)

{
  FString local_10;
  
  GetFormatString((FParser *)&stack0xfffffffffffffff0,(int)this);
  Printf(2,"%s\n",local_10.Chars);
  FString::~FString(&stack0xfffffffffffffff0);
  return;
}

Assistant:

void FParser::SF_Print(void)
{
	Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
}